

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O3

any * __thiscall hwnet::TCPSocket::GetUserData(TCPSocket *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return &this->ud;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const any& GetUserData() const {
		std::lock_guard<std::mutex> guard(this->mtx);
		return this->ud;
	}